

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SamplingMode::ByteSizeLong(SamplingMode *this)

{
  SamplingMode_Method SVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SamplingMode *this_local;
  
  sStack_18 = 0;
  SVar1 = samplingmethod(this);
  if (SVar1 != SamplingMode_Method_STRICT_ALIGN_ENDPOINTS_MODE) {
    SVar1 = samplingmethod(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(SVar1);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t SamplingMode::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SamplingMode)
  size_t total_size = 0;

  // .CoreML.Specification.SamplingMode.Method samplingMethod = 1;
  if (this->samplingmethod() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->samplingmethod());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}